

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLineBspline.cpp
# Opt level: O1

void __thiscall
chrono::geometry::ChLineBspline::Evaluate(ChLineBspline *this,ChVector<double> *pos,double parU)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  uint uVar5;
  int i;
  double *pdVar6;
  ulong uVar7;
  ChVectorDynamic<> N;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_38;
  double local_28;
  
  if (this->closed == true) {
    parU = fmod(parU,1.0);
  }
  local_28 = ComputeKnotUfromU(this,parU);
  i = ChBasisToolsBspline::FindSpan(this->p,local_28,&this->knots);
  local_38.m_storage.m_data = (double *)0x0;
  local_38.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&local_38,(long)this->p + 1);
  ChBasisToolsBspline::BasisEvaluate(this->p,i,local_28,&this->knots,(ChVectorDynamic<> *)&local_38)
  ;
  if (pos != (ChVector<double> *)&VNULL) {
    pos->m_data[0] = VNULL;
    pos->m_data[1] = DAT_00b90ac0;
    pos->m_data[2] = DAT_00b90ac8;
  }
  uVar5 = this->p;
  if (-1 < (int)uVar5) {
    dVar1 = pos->m_data[0];
    dVar2 = pos->m_data[1];
    dVar3 = pos->m_data[2];
    pdVar6 = (this->points).
             super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
             ._M_impl.super__Vector_impl_data._M_start[(int)(i - uVar5)].m_data + 2;
    uVar7 = 0;
    do {
      if ((~(local_38.m_storage.m_rows >> 0x3f) & local_38.m_storage.m_rows) == uVar7) {
        __assert_fail("index >= 0 && index < size()",
                      "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                      "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                     );
      }
      dVar4 = local_38.m_storage.m_data[uVar7];
      dVar1 = dVar4 * ((ChVector<double> *)(pdVar6 + -2))->m_data[0] + dVar1;
      dVar2 = dVar4 * pdVar6[-1] + dVar2;
      dVar3 = dVar4 * *pdVar6 + dVar3;
      pos->m_data[0] = dVar1;
      pos->m_data[1] = dVar2;
      pos->m_data[2] = dVar3;
      uVar7 = uVar7 + 1;
      pdVar6 = pdVar6 + 3;
    } while ((ulong)uVar5 + 1 != uVar7);
  }
  if (local_38.m_storage.m_data != (double *)0x0) {
    free((void *)local_38.m_storage.m_data[-1]);
  }
  return;
}

Assistant:

void ChLineBspline::Evaluate(ChVector<>& pos, const double parU) const {
	double mU;
	if (this->closed)
		mU = fmod(parU, 1.0);
	else
		mU = parU;

    double u = ComputeKnotUfromU(mU);

    int spanU = ChBasisToolsBspline::FindSpan(this->p, u, this->knots);

    ChVectorDynamic<> N(this->p + 1);
    ChBasisToolsBspline::BasisEvaluate(this->p, spanU, u, this->knots, N);

    pos = VNULL;
    int uind = spanU - p;
    for (int i = 0; i <= this->p; i++) {
        pos += points[uind + i] * N(i);
    }
}